

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Quaternion QuaternionFromVector3ToVector3(Vector3 from,Vector3 to)

{
  float fVar1;
  Vector3 VVar2;
  Quaternion QVar3;
  Vector3 cross;
  float cos2Theta;
  Vector3 to_local;
  Vector3 from_local;
  Quaternion result;
  
  fVar1 = Vector3DotProduct(from,to);
  VVar2 = Vector3CrossProduct(from,to);
  QVar3.w = fVar1 + 1.0;
  QVar3.x = VVar2.x;
  QVar3.y = VVar2.y;
  QVar3.z = VVar2.z;
  QVar3 = QuaternionNormalize(QVar3);
  return QVar3;
}

Assistant:

RMDEF Quaternion QuaternionFromVector3ToVector3(Vector3 from, Vector3 to)
{
    Quaternion result = { 0 };

    float cos2Theta = Vector3DotProduct(from, to);
    Vector3 cross = Vector3CrossProduct(from, to);

    result.x = cross.x;
    result.y = cross.y;
    result.z = cross.z;
    result.w = 1.0f + cos2Theta;     // NOTE: Added QuaternioIdentity()

    // Normalize to essentially nlerp the original and identity to 0.5
    result = QuaternionNormalize(result);

    // Above lines are equivalent to:
    //Quaternion result = QuaternionNlerp(q, QuaternionIdentity(), 0.5f);

    return result;
}